

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.hpp
# Opt level: O2

vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> * __thiscall
CompoundFile::SAT::sectors
          (vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *__return_storage_ptr__
          ,SAT *this,SecID *firstSector)

{
  const_reference pvVar1;
  wostream *this_00;
  Exception *this_01;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *result;
  wstring wStack_1c8;
  SecID id;
  wostream local_198 [376];
  
  if (firstSector->m_id <
      (int)((ulong)((long)(this->m_sat).
                          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_sat).
                         super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
    (__return_storage_ptr__->
    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::push_back
              (__return_storage_ptr__,firstSector);
    pvVar1 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                       (&this->m_sat,(long)firstSector->m_id);
    while (id.m_id = pvVar1->m_id, -1 < id.m_id) {
      std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::push_back
                (__return_storage_ptr__,&id);
      pvVar1 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                         (&this->m_sat,(long)id.m_id);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&id);
  this_00 = std::operator<<(local_198,L"There is no such sector with id: ");
  std::wostream::operator<<(this_00,firstSector->m_id);
  this_01 = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::wstringbuf::str();
  Exception::Exception(this_01,&wStack_1c8);
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline std::vector< SecID >
SAT::sectors( const SecID & firstSector ) const
{
	if( firstSector < static_cast< int32_t > ( m_sat.size() ) )
	{
		std::vector< SecID > result;

		result.push_back( firstSector );

		SecID id = m_sat.at( firstSector );

		while( true )
		{
			if( id >= 0 )
				result.push_back( id );
			else
				break;

			id = m_sat.at( id );
		}

		return result;
	}
	else
	{
		std::wstringstream stream;
		stream << L"There is no such sector with id: " << firstSector;

		throw Exception( stream.str() );
	}
}